

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_backend_buffer_type_t __thiscall llama_model::select_buft(llama_model *this,int il)

{
  ggml_backend_buffer_type_t pgVar1;
  vector<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_> *in_RDI;
  anon_class_8_1_8991fb9c *in_stack_00000038;
  buft_list_t *in_stack_00000040;
  size_type in_stack_ffffffffffffffd8;
  
  std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::operator->
            ((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)0x4a5f13);
  std::vector<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>::at
            (in_RDI,in_stack_ffffffffffffffd8);
  pgVar1 = select_buft<llama_model::select_buft(int)const::__0>(in_stack_00000040,in_stack_00000038)
  ;
  return pgVar1;
}

Assistant:

ggml_backend_buffer_type_t llama_model::select_buft(int il) const {
    return ::select_buft(
            *pimpl->dev_layer.at(il).buft_list,
            [&](ggml_context * ctx) {
                ggml_tensor * cur = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                ggml_tensor * layer_dir = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                return ggml_add(ctx, cur, layer_dir);
            });
}